

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::TSPI_PDU::Encode(TSPI_PDU *this,KDataStream *stream)

{
  KOCTET *pKVar1;
  byte bVar2;
  KOCTET *pKVar3;
  
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::Write(stream,(this->m_TSPIFlagUnion).m_ui8Flag);
  (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Loc,stream);
  bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  if ((bVar2 & 1) != 0) {
    (*(this->m_LinVel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_LinVel,stream);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 2) != 0) {
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 4) != 0) {
    (*(this->m_PosErr).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_PosErr,stream);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 8) != 0) {
    (*(this->m_OriErr).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_OriErr,stream);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x10) != 0) {
    (*(this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase[5])
              (&this->m_DeadReckoningParameter,stream);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x20) != 0) {
    (*(this->m_MeasureSpd).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_MeasureSpd,stream);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x40) != 0) {
    KDataStream::Write(stream,this->m_ui8SSDLen);
    pKVar1 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pKVar3 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
      KDataStream::Write(stream,*pKVar3);
    }
  }
  return;
}

Assistant:

void TSPI_PDU::Encode( KDataStream & stream ) const
{

    LE_Header::Encode( stream );

    stream << m_TSPIFlagUnion.m_ui8Flag
           << KDIS_STREAM m_Loc;

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        stream << KDIS_STREAM m_LinVel;
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        stream << KDIS_STREAM m_Ori;
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        stream << KDIS_STREAM m_PosErr;
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        stream << KDIS_STREAM m_OriErr;
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        stream << KDIS_STREAM m_DeadReckoningParameter;
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        stream << KDIS_STREAM m_MeasureSpd;
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        stream << m_ui8SSDLen;

        // Encode System Specific Data
        vector<KOCTET>::const_iterator citr = m_vSSD.begin();
        vector<KOCTET>::const_iterator citrEnd = m_vSSD.end();
        for( ; citr != citrEnd; ++citr )
        {
            stream << *citr;
        }
    }
}